

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O0

vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* gmlc::utilities::
  generalized_string_split<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>
            (basic_string_view<char,_std::char_traits<char>_> *str,
            basic_string_view<char,_std::char_traits<char>_> *delimiterCharacters,bool compress)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *pvVar1;
  byte in_CL;
  undefined8 *in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_type start;
  size_type pos;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *ret;
  value_type *in_stack_ffffffffffffff18;
  basic_string_view<char,_std::char_traits<char>_> *this;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff28;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *in_stack_ffffffffffffff30;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  undefined8 local_80;
  undefined8 local_78;
  basic_string_view<char,_std::char_traits<char>_> local_70 [2];
  basic_string_view<char,_std::char_traits<char>_> local_50;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_40;
  undefined8 local_38;
  undefined8 local_30;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_28;
  undefined1 local_1a;
  byte local_19;
  undefined8 *local_18;
  basic_string_view<char,_std::char_traits<char>_> *local_10;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  CLI::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)0x782034);
  local_38 = *local_18;
  local_30 = local_18[1];
  __str._M_str = (char *)in_stack_ffffffffffffff30;
  __str._M_len = (size_t)in_stack_ffffffffffffff28;
  local_28 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (in_stack_ffffffffffffff20,__str,(size_type)in_stack_ffffffffffffff18);
  local_40 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)0x0;
  while (local_28 !=
         (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *)0xffffffffffffffff) {
    if (local_28 == local_40) {
      if ((local_19 & 1) == 0) {
        in_stack_ffffffffffffff38 = local_70;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_ffffffffffffff38);
        std::
        vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      }
    }
    else {
      bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                         (size_type)in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff40 = (basic_string_view<char,_std::char_traits<char>_> *)bVar2._M_str;
      local_50 = bVar2;
      std::
      vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    }
    local_40 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)((long)&(local_28->
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1);
    local_80 = *local_18;
    local_78 = local_18[1];
    __str_00._M_str = (char *)in_stack_ffffffffffffff30;
    __str_00._M_len = (size_t)in_stack_ffffffffffffff28;
    local_28 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *)CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                            (in_stack_ffffffffffffff20,__str_00,(size_type)in_stack_ffffffffffffff18
                            );
  }
  this_00 = local_40;
  pvVar1 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            *)std::basic_string_view<char,_std::char_traits<char>_>::length(local_10);
  if (this_00 < pvVar1) {
    local_90 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (in_stack_ffffffffffffff40,(size_type)in_stack_ffffffffffffff38,
                          (size_type)this_00);
    std::
    vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::emplace_back<std::basic_string_view<char,std::char_traits<char>>>
              (this_00,(basic_string_view<char,_std::char_traits<char>_> *)local_90._M_len);
  }
  else if ((local_19 & 1) == 0) {
    this = &local_a0;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(this);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::push_back((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)in_stack_ffffffffffffff20,this);
  }
  return in_RDI;
}

Assistant:

std::vector<XO> generalized_string_split(
    const X& str,
    const X& delimiterCharacters,
    bool compress)
{
    std::vector<XO> ret;

    auto pos = str.find_first_of(delimiterCharacters);
    decltype(pos) start = 0;
    while (pos != X::npos) {
        if (pos != start) {
            ret.emplace_back(str.substr(start, pos - start));
        } else if (!compress) {
            ret.push_back(XO());
        }
        start = pos + 1;
        pos = str.find_first_of(delimiterCharacters, start);
    }
    if (start < str.length()) {
        ret.emplace_back(str.substr(start));
    } else if (!compress) {
        ret.push_back(XO());
    }
    return ret;
}